

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O0

type __thiscall
itlib::
flat_map<unsigned_long,unsigned_long,itlib::fmimpl::less,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
::operator[]<unsigned_long&>
          (flat_map<unsigned_long,unsigned_long,itlib::fmimpl::less,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
           *this,unsigned_long *k)

{
  iterator a;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference b;
  pointer ppVar3;
  void *extraout_RDX;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *__rhs;
  byte local_49;
  unsigned_long local_48;
  const_iterator local_40;
  pair<unsigned_long,_unsigned_long> *local_38;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_30;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_28;
  iterator i;
  unsigned_long *k_local;
  flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this_local;
  
  i._M_current = (pair<unsigned_long,_unsigned_long> *)k;
  local_28._M_current =
       (pair<unsigned_long,_unsigned_long> *)
       flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::lower_bound<unsigned_long>
                 ((flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *)this,k);
  local_30._M_current =
       (pair<unsigned_long,_unsigned_long> *)
       flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::end((flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)this);
  __rhs = &local_30;
  bVar1 = __gnu_cxx::operator!=(&local_28,__rhs);
  local_49 = 0;
  if (bVar1) {
    iVar2 = flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::cmp((flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *)this,__rhs,extraout_RDX);
    a = i;
    b = __gnu_cxx::
        __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::operator*(&local_28);
    bVar1 = fmimpl::pair_compare<unsigned_long,unsigned_long,itlib::fmimpl::less>::operator()
                      ((void *)CONCAT44(extraout_var,iVar2),&(a._M_current)->first,b);
    local_49 = bVar1 ^ 0xff;
  }
  if ((local_49 & 1) == 0) {
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::__normal_iterator<std::pair<unsigned_long,unsigned_long>*>
              ((__normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
                *)&local_40,&local_28);
    local_48 = 0;
    local_38 = (pair<unsigned_long,_unsigned_long> *)
               std::
               vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               ::emplace<unsigned_long&,unsigned_long>
                         ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                           *)this,local_40,&(i._M_current)->first,&local_48);
    local_28._M_current = local_38;
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator->(&local_28);
  }
  else {
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator->(&local_28);
  }
  this_local = (flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)&ppVar3->second;
  return (type)this_local;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }